

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_data.cc
# Opt level: O1

int CRYPTO_set_ex_data(CRYPTO_EX_DATA *ad,int idx,void *val)

{
  ulong i;
  OPENSSL_STACK *pOVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  bool bVar5;
  
  if (idx < 0) {
    abort();
  }
  i = (ulong)(uint)idx;
  if (ad->sk == (stack_st_void *)0x0) {
    pOVar1 = OPENSSL_sk_new_null();
    ad->sk = (stack_st_void *)pOVar1;
    if (pOVar1 == (OPENSSL_STACK *)0x0) {
      return 0;
    }
  }
  sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)ad->sk);
  bVar5 = i < sVar2;
  if (sVar2 <= i) {
    sVar3 = OPENSSL_sk_push((OPENSSL_STACK *)ad->sk,(void *)0x0);
    if (sVar3 != 0) {
      lVar4 = 1 - sVar2;
      do {
        if (i + lVar4 == 1) goto LAB_0048d8c6;
        sVar2 = OPENSSL_sk_push((OPENSSL_STACK *)ad->sk,(void *)0x0);
        lVar4 = lVar4 + -1;
      } while (sVar2 != 0);
      bVar5 = i <= (ulong)-lVar4;
    }
    if (!bVar5) {
      return 0;
    }
  }
LAB_0048d8c6:
  OPENSSL_sk_set((OPENSSL_STACK *)ad->sk,i,val);
  return 1;
}

Assistant:

int CRYPTO_set_ex_data(CRYPTO_EX_DATA *ad, int index, void *val) {
  if (index < 0) {
    // A caller that can accidentally pass in an invalid index into this
    // function will hit an memory error if |index| happened to be valid, and
    // expected |val| to be of a different type.
    abort();
  }

  if (ad->sk == NULL) {
    ad->sk = sk_void_new_null();
    if (ad->sk == NULL) {
      return 0;
    }
  }

  // Add NULL values until the stack is long enough.
  for (size_t i = sk_void_num(ad->sk); i <= (size_t)index; i++) {
    if (!sk_void_push(ad->sk, NULL)) {
      return 0;
    }
  }

  sk_void_set(ad->sk, (size_t)index, val);
  return 1;
}